

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

bool nv::ImageIO::save(char *fileName,Image *img)

{
  bool bVar1;
  StdOutputStream stream;
  StdStream local_30;
  
  local_30.m_fp = fileOpen(fileName,"wb");
  local_30.super_Stream.m_byteOrder = LittleEndian;
  local_30.m_autoclose = true;
  local_30.super_Stream._vptr_Stream = (_func_int **)&PTR__StdStream_0023d7c8;
  bVar1 = StdStream::isError(&local_30);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = save(fileName,&local_30.super_Stream,img);
  }
  StdStream::~StdStream(&local_30);
  return bVar1;
}

Assistant:

bool nv::ImageIO::save(const char * fileName, Image * img)
{
	nvDebugCheck(fileName != NULL);
	nvDebugCheck(img != NULL);

	StdOutputStream stream(fileName);
	if (stream.isError())
	{
		return false;
	}

	return ImageIO::save(fileName, stream, img);
}